

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O2

void __thiscall avro::StreamWriter::more(StreamWriter *this)

{
  int iVar1;
  Exception *this_00;
  allocator<char> local_49;
  size_t n;
  string local_40;
  
  n = 0;
  do {
    iVar1 = (*this->out_->_vptr_OutputStream[2])(this->out_,&this->next_,&n);
    if ((char)iVar1 == '\0') {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"EOF reached",&local_49);
      Exception::Exception(this_00,&local_40);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  } while (n == 0);
  this->end_ = this->next_ + n;
  return;
}

Assistant:

void more() {
        size_t n = 0;
        while (out_->next(&next_, &n)) {
            if (n != 0) {
                end_ = next_ + n;
                return;
            }
        }
        throw Exception("EOF reached");
    }